

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort_wrapper.hpp
# Opt level: O0

bool dss::check<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_int>
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      end,vector<unsigned_int,_std::allocator<unsigned_int>_> *SA)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  runtime_error *this;
  reference pcVar4;
  const_reference pvVar5;
  size_t n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *SA_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin_local;
  
  end_local = begin;
  uVar2 = std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(begin,end);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(SA);
  if (sVar3 == uVar2) {
    iVar1 = std::numeric_limits<int>::max();
    if ((ulong)(long)iVar1 <= uVar2) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Input size is too large for 32bit indexing.");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&end_local);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](SA,0);
    iVar1 = sufcheck(pcVar4,pvVar5,uVar2 & 0xffffffff,1);
    begin_local._M_current._7_1_ = iVar1 == 0;
  }
  else {
    begin_local._M_current._7_1_ = false;
  }
  return begin_local._M_current._7_1_;
}

Assistant:

bool check(InputIterator begin, InputIterator end, const std::vector<T>& SA)
{
    typedef typename std::iterator_traits<InputIterator>::value_type char_t;
    if (sizeof(char_t) != 1)
        throw std::runtime_error("Input must be a char type");
    std::size_t n = std::distance(begin, end);
    if (SA.size() != n)
        return false;
    if (sizeof(T) == sizeof(saidx_t)) {
        if (n >= std::numeric_limits<saidx_t>::max())
            throw std::runtime_error("Input size is too large for 32bit indexing.");
        return sufcheck(reinterpret_cast<const sauchar_t*>(&(*begin)),
                        reinterpret_cast<const saidx_t*>(&SA[0]), n, 1) == 0;
    } else if (sizeof(T) == sizeof(saidx64_t)) {
        return sufcheck64(reinterpret_cast<const sauchar_t*>(&(*begin)),
                          reinterpret_cast<const saidx64_t*>(&SA[0]), n, 1) == 0;
    } else {
        throw std::runtime_error("Unsupported datatype of Suffix Array.");
    }
}